

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O3

void __thiscall Centaurus::Stage1Runner::~Stage1Runner(Stage1Runner *this)

{
  sem_t *__sem;
  pointer pCVar1;
  
  (this->super_BaseRunner).super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__Stage1Runner_0019d7b0;
  __sem = (sem_t *)(this->super_BaseRunner).m_slave_lock;
  if (__sem != (sem_t *)0x0) {
    sem_close(__sem);
  }
  sem_unlink((this->super_BaseRunner).m_slave_lock_name);
  BaseRunner::release_memory(&this->super_BaseRunner,true);
  pCVar1 = (this->result_chunks_).
           super__Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1);
  }
  (this->super_BaseRunner).super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__BaseRunner_0019d840;
  munmap((this->super_BaseRunner).m_input_window,(this->super_BaseRunner).m_input_size);
  return;
}

Assistant:

virtual ~Stage1Runner() {
    close_semaphore(true);
    release_memory(true);
  }